

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::PositionCommand(UCIAdapter *this,char *params)

{
  size_t __n;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  undefined4 extraout_var_01;
  char *move;
  char *params_local;
  Output local_38;
  
  params_local = params;
  if (((params == (char *)0x0) || (*params == '\0')) ||
     (bVar2 = ParamMatch((string *)token::Help_abi_cxx11_,&params_local), bVar2)) {
    Output::Output(&local_38,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"usage: ");
    std::operator<<((ostream *)&std::cout,(string *)token::Position_abi_cxx11_);
    std::operator<<((ostream *)&std::cout," {");
    std::operator<<((ostream *)&std::cout,(string *)token::StartPos_abi_cxx11_);
    std::operator<<((ostream *)&std::cout,"|");
    std::operator<<((ostream *)&std::cout,(string *)token::Fen_abi_cxx11_);
    std::operator<<((ostream *)&std::cout," <fen_string>} [<movelist>]");
    Output::~Output(&local_38);
    Output::Output(&local_38,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"Set a new position and apply <movelist> (if given).");
    Output::~Output(&local_38);
  }
  else {
    iVar3 = (*this->engine->_vptr_ChessEngine[8])();
    if ((char)iVar3 == '\0') {
      (*this->engine->_vptr_ChessEngine[7])();
      (this->lastPosition)._M_string_length = 0;
      *(this->lastPosition)._M_dataplus._M_p = '\0';
    }
    pcVar1 = params_local;
    __n = (this->lastPosition)._M_string_length;
    if ((__n == 0) ||
       (iVar3 = strncmp(params_local,(this->lastPosition)._M_dataplus._M_p,__n), iVar3 != 0)) {
      bVar2 = ParamMatch((string *)token::StartPos_abi_cxx11_,&params_local);
      if (bVar2) {
        iVar3 = (*this->engine->_vptr_ChessEngine[9])(this->engine,ChessEngine::_STARTPOS);
        if (CONCAT44(extraout_var,iVar3) == 0) {
          return;
        }
      }
      else {
        ParamMatch((string *)token::Fen_abi_cxx11_,&params_local);
        iVar3 = (*this->engine->_vptr_ChessEngine[9])(this->engine,params_local);
        params_local = (char *)CONCAT44(extraout_var_00,iVar3);
      }
    }
    else {
      params_local = pcVar1 + __n;
      NextWord(&params_local);
    }
    NextWord(&params_local);
    ParamMatch((string *)token::Moves_abi_cxx11_,&params_local);
    if (params_local != (char *)0x0) {
      do {
        pcVar4 = NextWord(&params_local);
        pcVar1 = params_local;
        if ((*pcVar4 == '\0') || (bVar2 = IsMove(params_local), !bVar2)) goto LAB_0012c2af;
        iVar3 = (*this->engine->_vptr_ChessEngine[10])(this->engine,pcVar1);
        params_local = (char *)CONCAT44(extraout_var_01,iVar3);
      } while (params_local != (char *)0x0);
      Output::Output(&local_38,InfoPrefix);
      std::operator<<((ostream *)&std::cout,"Invalid move: ");
      std::operator<<((ostream *)&std::cout,pcVar1);
      Output::~Output(&local_38);
    }
LAB_0012c2af:
    std::__cxx11::string::assign((char *)&this->lastPosition);
    if (ChessEngine::_debug == '\x01') {
      (*this->engine->_vptr_ChessEngine[0xc])();
    }
  }
  return;
}

Assistant:

void UCIAdapter::PositionCommand(const char* params)
{
  if (!params || !*params || ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Position << " {" << token::StartPos << "|"
             << token::Fen << " <fen_string>} [<movelist>]";
    Output() << "Set a new position and apply <movelist> (if given).";
    return;
  }

  if (!engine->IsInitialized()) {
    engine->Initialize();
    lastPosition.clear();
  }

  const char* position = params;
  if (lastPosition.size() &&
      !strncmp(params, lastPosition.c_str(), lastPosition.size()))
  {
    NextWord(params += lastPosition.size());
  }
  else {
    if (ParamMatch(token::StartPos, params)) {
      if (!engine->SetPosition(ChessEngine::_STARTPOS)) {
        return;
      }
    }
    else {
      ParamMatch(token::Fen, params);
      params = engine->SetPosition(params);
    }
  }

  // simply consume "moves" token if present
  NextWord(params);
  ParamMatch(token::Moves, params);

  // apply moves (if any)
  while (params && *NextWord(params)) {
    const char* move = params;
    if (!IsMove(move)) {
      break;
    }
    if (!(params = engine->MakeMove(params))) {
      Output() << "Invalid move: " << move;
      break;
    }
  }

  lastPosition = params ? position : "";
  if (engine->IsDebugOn()) {
    engine->PrintBoard();
  }
}